

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_usub16_aarch64(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  uint uVar2;
  uint32_t sum_1;
  uint32_t sum;
  uint32_t ge;
  uint32_t res;
  void *gep_local;
  uint32_t b_local;
  uint32_t a_local;
  
  sum_1 = 0;
  uVar1 = (a & 0xffff) - (b & 0xffff);
  if (uVar1 >> 0x10 == 0) {
    sum_1 = 3;
  }
  uVar2 = (a >> 0x10) - (b >> 0x10);
  if (uVar2 >> 0x10 == 0) {
    sum_1 = sum_1 | 0xc;
  }
  *(uint32_t *)gep = sum_1;
  return uVar2 * 0x10000 | uVar1 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,sub16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB16(a, b, 0);
    SUB16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}